

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O1

void compareB44(int width,int height,Array2D<Imath_3_2::half> *p1,Array2D<Imath_3_2::half> *p2)

{
  long lVar1;
  half *phVar2;
  long lVar3;
  half *phVar4;
  bool bVar5;
  half *phVar6;
  half *phVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int x1;
  long lVar11;
  int iVar12;
  uint uVar13;
  half B [4] [4];
  half A [4] [4];
  half local_78 [16];
  half local_58 [20];
  
  if (0 < height) {
    lVar1 = p1->_sizeY;
    phVar2 = p1->_data;
    lVar3 = p2->_sizeY;
    phVar4 = p2->_data;
    uVar13 = 0;
    do {
      if (0 < width) {
        iVar9 = 0;
        do {
          phVar6 = local_78;
          phVar7 = local_58;
          lVar8 = 0;
          do {
            uVar10 = (uint)lVar8 | uVar13;
            if ((int)(height - 1U) < (int)uVar10) {
              uVar10 = height - 1U;
            }
            lVar11 = 0;
            do {
              iVar12 = iVar9 + (int)lVar11;
              if (width + -1 < iVar12) {
                iVar12 = width + -1;
              }
              phVar7[lVar11]._h = phVar2[lVar1 * (int)uVar10 + (long)iVar12]._h;
              phVar6[lVar11]._h = phVar4[(int)uVar10 * lVar3 + (long)iVar12]._h;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 4);
            lVar8 = lVar8 + 1;
            phVar7 = phVar7 + 4;
            phVar6 = phVar6 + 4;
          } while (lVar8 != 4);
          bVar5 = withinB44ErrorBounds((half (*) [4])local_58,(half (*) [4])local_78);
          if (!bVar5) {
            __assert_fail("withinB44ErrorBounds (A, B)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/compareB44.cpp"
                          ,0xc4,
                          "void compareB44(int, int, const Array2D<half> &, const Array2D<half> &)")
            ;
          }
          iVar9 = iVar9 + 4;
        } while (iVar9 < width);
      }
      uVar13 = uVar13 + 4;
    } while ((int)uVar13 < height);
  }
  return;
}

Assistant:

void
compareB44 (
    int width, int height, const Array2D<half>& p1, const Array2D<half>& p2)
{
    for (int y = 0; y < height; y += 4)
    {
        for (int x = 0; x < width; x += 4)
        {
            half A[4][4];
            half B[4][4];

            for (int y1 = 0; y1 < 4; ++y1)
            {
                for (int x1 = 0; x1 < 4; ++x1)
                {
                    int y2    = min (y + y1, height - 1);
                    int x2    = min (x + x1, width - 1);
                    A[y1][x1] = p1[y2][x2];
                    B[y1][x1] = p2[y2][x2];
                }
            }

            assert (withinB44ErrorBounds (A, B));
        }
    }
}